

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.cpp
# Opt level: O0

void __thiscall SkipList::~SkipList(SkipList *this)

{
  Node *this_00;
  SkipList *this_local;
  
  reset(this);
  this_00 = this->head;
  if (this_00 != (Node *)0x0) {
    Node::~Node(this_00);
    operator_delete(this_00,0x38);
  }
  std::random_device::~random_device(&this->rd);
  return;
}

Assistant:

SkipList::~SkipList() {
  reset();
  delete head;
}